

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log_perftest.cc
# Opt level: O2

int main(void)

{
  int iVar1;
  bool bVar2;
  LoadStatus LVar3;
  int64_t iVar4;
  int64_t iVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  size_t i;
  ulong uVar9;
  int iVar10;
  int iVar11;
  float fVar12;
  allocator<char> local_fd;
  uint local_fc;
  vector<int,_std::allocator<int>_> times;
  string err;
  int delta;
  BuildLog log;
  
  times.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  times.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  times.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  bVar2 = WriteTestData(&err);
  if (bVar2) {
    BuildLog::BuildLog(&log);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&delta,"BuildLogPerfTest-tempfile",&local_fd);
    LVar3 = BuildLog::Load(&log,(string *)&delta,&err);
    std::__cxx11::string::~string((string *)&delta);
    if (LVar3 == LOAD_ERROR) {
      fprintf(_stderr,"Failed to read test data: %s\n",err._M_dataplus._M_p);
    }
    local_fc = (uint)(LVar3 == LOAD_ERROR);
    BuildLog::~BuildLog(&log);
    if (LVar3 != LOAD_ERROR) {
      iVar11 = 6;
      do {
        iVar11 = iVar11 + -1;
        if (iVar11 == 0) {
          iVar11 = *times.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar6 = (long)times.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)times.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2;
          fVar12 = 0.0;
          iVar7 = iVar11;
          for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
            iVar1 = times.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar9];
            iVar10 = iVar11;
            if (iVar11 < iVar1) {
              iVar10 = iVar1;
            }
            iVar8 = iVar7;
            if (iVar1 < iVar7) {
              iVar8 = iVar1;
            }
            fVar12 = fVar12 + (float)iVar1;
            if (iVar7 <= iVar1) {
              iVar11 = iVar10;
            }
            iVar7 = iVar8;
          }
          printf("min %dms  max %dms  avg %.1fms\n",SUB84((double)(fVar12 / (float)uVar6),0));
          unlink("BuildLogPerfTest-tempfile");
          local_fc = 0;
          break;
        }
        iVar4 = GetTimeMillis();
        BuildLog::BuildLog(&log);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&delta,"BuildLogPerfTest-tempfile",&local_fd);
        LVar3 = BuildLog::Load(&log,(string *)&delta,&err);
        std::__cxx11::string::~string((string *)&delta);
        if (LVar3 == LOAD_ERROR) {
          fprintf(_stderr,"Failed to read test data: %s\n",err._M_dataplus._M_p);
          local_fc = 1;
        }
        else {
          iVar5 = GetTimeMillis();
          delta = (int)iVar5 - (int)iVar4;
          printf("%dms\n",(ulong)(uint)delta);
          std::vector<int,_std::allocator<int>_>::push_back(&times,(value_type_conflict *)&delta);
        }
        BuildLog::~BuildLog(&log);
      } while (LVar3 != LOAD_ERROR);
    }
  }
  else {
    fprintf(_stderr,"Failed to write test data: %s\n",err._M_dataplus._M_p);
    local_fc = 1;
  }
  std::__cxx11::string::~string((string *)&err);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&times.super__Vector_base<int,_std::allocator<int>_>);
  return local_fc;
}

Assistant:

int main() {
  vector<int> times;
  string err;

  if (!WriteTestData(&err)) {
    fprintf(stderr, "Failed to write test data: %s\n", err.c_str());
    return 1;
  }

  {
    // Read once to warm up disk cache.
    BuildLog log;
    if (!log.Load(kTestFilename, &err)) {
      fprintf(stderr, "Failed to read test data: %s\n", err.c_str());
      return 1;
    }
  }
  const int kNumRepetitions = 5;
  for (int i = 0; i < kNumRepetitions; ++i) {
    int64_t start = GetTimeMillis();
    BuildLog log;
    if (!log.Load(kTestFilename, &err)) {
      fprintf(stderr, "Failed to read test data: %s\n", err.c_str());
      return 1;
    }
    int delta = (int)(GetTimeMillis() - start);
    printf("%dms\n", delta);
    times.push_back(delta);
  }

  int min = times[0];
  int max = times[0];
  float total = 0;
  for (size_t i = 0; i < times.size(); ++i) {
    total += times[i];
    if (times[i] < min)
      min = times[i];
    else if (times[i] > max)
      max = times[i];
  }

  printf("min %dms  max %dms  avg %.1fms\n",
         min, max, total / times.size());

  unlink(kTestFilename);

  return 0;
}